

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_sig_recover
              (secp256k1_scalar *sigr,secp256k1_scalar *sigs,secp256k1_ge *pubkey,
              secp256k1_scalar *message,int recid)

{
  int iVar1;
  int iVar2;
  uint in_R8D;
  int r;
  secp256k1_gej qj;
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar rn;
  secp256k1_gej xj;
  secp256k1_ge x;
  secp256k1_fe fx;
  uchar brx [32];
  secp256k1_scalar *in_stack_00000458;
  secp256k1_scalar *in_stack_00000460;
  secp256k1_gej *in_stack_00000468;
  secp256k1_gej *in_stack_00000470;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  secp256k1_gej *in_stack_fffffffffffffdd0;
  secp256k1_gej *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  secp256k1_fe *in_stack_fffffffffffffe38;
  secp256k1_ge *in_stack_fffffffffffffe40;
  
  iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x10689c);
  if ((iVar1 != 0) || (iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x1068ae), iVar1 != 0))
  {
    return 0;
  }
  secp256k1_scalar_get_b32
            ((uchar *)in_stack_fffffffffffffdd0,
             (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  iVar1 = secp256k1_fe_set_b32_limit
                    ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (uchar *)0x1068ed);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/recovery/main_impl.h"
            ,0x67,"test condition failed: r");
    abort();
  }
  if ((in_R8D & 2) != 0) {
    iVar2 = secp256k1_fe_cmp_var
                      (&in_stack_fffffffffffffdd0->x,
                       (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffdc8));
    if (-1 < iVar2) {
      return 0;
    }
    secp256k1_fe_add(&in_stack_fffffffffffffdd0->x,
                     (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffdc8));
  }
  iVar2 = secp256k1_ge_set_xo_var
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
  if (iVar2 == 0) {
    return 0;
  }
  secp256k1_gej_set_ge
            (in_stack_fffffffffffffdd0,(secp256k1_ge *)CONCAT44(iVar1,in_stack_fffffffffffffdc8));
  secp256k1_scalar_inverse_var
            ((secp256k1_scalar *)in_stack_fffffffffffffdd0,
             (secp256k1_scalar *)CONCAT44(iVar1,in_stack_fffffffffffffdc8));
  secp256k1_scalar_mul
            ((secp256k1_scalar *)in_stack_fffffffffffffdd0,
             (secp256k1_scalar *)CONCAT44(iVar1,in_stack_fffffffffffffdc8),
             (secp256k1_scalar *)0x106a03);
  secp256k1_scalar_negate
            ((secp256k1_scalar *)in_stack_fffffffffffffdd0,
             (secp256k1_scalar *)CONCAT44(iVar1,in_stack_fffffffffffffdc8));
  secp256k1_scalar_mul
            ((secp256k1_scalar *)in_stack_fffffffffffffdd0,
             (secp256k1_scalar *)CONCAT44(iVar1,in_stack_fffffffffffffdc8),
             (secp256k1_scalar *)0x106a30);
  secp256k1_ecmult(in_stack_00000470,in_stack_00000468,in_stack_00000460,in_stack_00000458);
  secp256k1_ge_set_gej_var
            ((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             in_stack_fffffffffffffe28);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x106a6e);
  return (uint)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

static int secp256k1_ecdsa_sig_recover(const secp256k1_scalar *sigr, const secp256k1_scalar* sigs, secp256k1_ge *pubkey, const secp256k1_scalar *message, int recid) {
    unsigned char brx[32];
    secp256k1_fe fx;
    secp256k1_ge x;
    secp256k1_gej xj;
    secp256k1_scalar rn, u1, u2;
    secp256k1_gej qj;
    int r;

    if (secp256k1_scalar_is_zero(sigr) || secp256k1_scalar_is_zero(sigs)) {
        return 0;
    }

    secp256k1_scalar_get_b32(brx, sigr);
    r = secp256k1_fe_set_b32_limit(&fx, brx);
    (void)r;
    VERIFY_CHECK(r); /* brx comes from a scalar, so is less than the order; certainly less than p */
    if (recid & 2) {
        if (secp256k1_fe_cmp_var(&fx, &secp256k1_ecdsa_const_p_minus_order) >= 0) {
            return 0;
        }
        secp256k1_fe_add(&fx, &secp256k1_ecdsa_const_order_as_fe);
    }
    if (!secp256k1_ge_set_xo_var(&x, &fx, recid & 1)) {
        return 0;
    }
    secp256k1_gej_set_ge(&xj, &x);
    secp256k1_scalar_inverse_var(&rn, sigr);
    secp256k1_scalar_mul(&u1, &rn, message);
    secp256k1_scalar_negate(&u1, &u1);
    secp256k1_scalar_mul(&u2, &rn, sigs);
    secp256k1_ecmult(&qj, &xj, &u2, &u1);
    secp256k1_ge_set_gej_var(pubkey, &qj);
    return !secp256k1_gej_is_infinity(&qj);
}